

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_msgs.c
# Opt level: O2

void voutf(GlobalConfig *config,char *prefix,char *fmt,__va_list_tag *ap)

{
  long lVar1;
  long lVar2;
  uint uVar3;
  size_t sVar4;
  char *__s;
  size_t sVar5;
  long lVar6;
  char *__s_00;
  
  uVar3 = get_terminal_columns();
  sVar4 = strlen(prefix);
  if (((config->field_0x64 & 1) != 0) || (__s = (char *)curl_mvaprintf(fmt,ap), __s == (char *)0x0))
  {
    return;
  }
  sVar5 = strlen(__s);
  lVar1 = (uVar3 - sVar4) - 1;
  __s_00 = __s;
  do {
    while( true ) {
      if (sVar5 == 0) {
        curl_free(__s);
        return;
      }
      fputs(prefix,(FILE *)tool_stderr);
      lVar2 = lVar1;
      if (uVar3 - sVar4 < sVar5) break;
      fputs(__s_00,(FILE *)tool_stderr);
      fputs("\n",(FILE *)tool_stderr);
      sVar5 = 0;
    }
    do {
      lVar6 = lVar2;
      if ((__s_00[lVar6] == ' ') || (lVar6 == 0)) break;
      lVar2 = lVar6 + -1;
    } while (__s_00[lVar6] != '\t');
    if (lVar6 == 0) {
      lVar6 = lVar1;
    }
    fwrite(__s_00,lVar6 + 1U,1,(FILE *)tool_stderr);
    fputs("\n",(FILE *)tool_stderr);
    __s_00 = __s_00 + lVar6 + 1;
    sVar5 = sVar5 - (lVar6 + 1U);
  } while( true );
}

Assistant:

static void voutf(struct GlobalConfig *config,
                  const char *prefix,
                  const char *fmt,
                  va_list ap)
{
  size_t width = (get_terminal_columns() - strlen(prefix));
  DEBUGASSERT(!strchr(fmt, '\n'));
  if(!config->silent) {
    size_t len;
    char *ptr;
    char *print_buffer;

    print_buffer = vaprintf(fmt, ap);
    if(!print_buffer)
      return;
    len = strlen(print_buffer);

    ptr = print_buffer;
    while(len > 0) {
      fputs(prefix, tool_stderr);

      if(len > width) {
        size_t cut = width-1;

        while(!ISBLANK(ptr[cut]) && cut) {
          cut--;
        }
        if(0 == cut)
          /* not a single cutting position was found, just cut it at the
             max text width then! */
          cut = width-1;

        (void)fwrite(ptr, cut + 1, 1, tool_stderr);
        fputs("\n", tool_stderr);
        ptr += cut + 1; /* skip the space too */
        len -= cut + 1;
      }
      else {
        fputs(ptr, tool_stderr);
        fputs("\n", tool_stderr);
        len = 0;
      }
    }
    curl_free(print_buffer);
  }
}